

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int aa_index(char aa)

{
  ostream *poVar1;
  invalid_argument *this;
  char in_DIL;
  int local_4;
  
  switch(in_DIL) {
  case 'A':
    local_4 = 0;
    break;
  default:
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)in_DIL);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,in_DIL);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"no char found");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 'C':
    local_4 = 4;
    break;
  case 'D':
    local_4 = 3;
    break;
  case 'E':
    local_4 = 6;
    break;
  case 'F':
    local_4 = 0xd;
    break;
  case 'G':
    local_4 = 7;
    break;
  case 'H':
    local_4 = 8;
    break;
  case 'I':
    local_4 = 10;
    break;
  case 'K':
    local_4 = 0xc;
    break;
  case 'L':
    local_4 = 0xb;
    break;
  case 'M':
    local_4 = 9;
    break;
  case 'N':
    local_4 = 2;
    break;
  case 'P':
    local_4 = 0xe;
    break;
  case 'Q':
    local_4 = 5;
    break;
  case 'R':
    local_4 = 1;
    break;
  case 'S':
    local_4 = 0xf;
    break;
  case 'T':
    local_4 = 0x10;
    break;
  case 'V':
    local_4 = 0x13;
    break;
  case 'W':
    local_4 = 0x11;
    break;
  case 'Y':
    local_4 = 0x12;
  }
  return local_4;
}

Assistant:

int aa_index(char aa) {
    switch (aa) {
        case 'A': return 0;
        case 'R': return 1;
        case 'N': return 2;
        case 'D': return 3;
        case 'C': return 4;
        case 'Q': return 5;
        case 'E': return 6;
        case 'G': return 7;
        case 'H': return 8;
        case 'M': return 9;
        case 'I': return 10;
        case 'L': return 11;
        case 'K': return 12;
        case 'F': return 13;
        case 'P': return 14;
        case 'S': return 15;
        case 'T': return 16;
        case 'W': return 17;
        case 'Y': return 18;
        case 'V': return 19;
        default:
            cout << (int)aa << " " << (char)aa << endl;
            throw invalid_argument("no char found");
    }
}